

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_266c4a5::SSETest::SetUp(SSETest *this)

{
  _func_long_uchar_ptr_int_uchar_ptr_int_int_int *p_Var1;
  internal iVar2;
  undefined8 *puVar3;
  ParamType *pPVar4;
  uint8_t *puVar5;
  SEARCH_METHODS *pSVar6;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  pPVar4 = testing::
           WithParamInterface<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
           ::GetParam();
  p_Var1 = (pPVar4->
           super__Tuple_impl<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>
           ).
           super__Head_base<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_false>
           ._M_head_impl.tst_func;
  (this->params_).ref_func =
       (pPVar4->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>
       ).
       super__Head_base<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_false>
       ._M_head_impl.ref_func;
  (this->params_).tst_func = p_Var1;
  (this->params_).bit_depth =
       (pPVar4->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>
       ).
       super__Head_base<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_false>
       ._M_head_impl.bit_depth;
  pPVar4 = testing::
           WithParamInterface<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
           ::GetParam();
  this->width_ = (pPVar4->
                 super__Tuple_impl<0UL,_libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>
                 ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  this->is_hbd_ = (this->params_).ref_func == aom_highbd_sse_c;
  (this->rnd_).random_.state_ = 0xbaba;
  puVar5 = (uint8_t *)aom_memalign(0x20,0x20000);
  this->src_ = puVar5;
  puVar5 = (uint8_t *)aom_memalign(0x20,0x20000);
  this->ref_ = puVar5;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (local_30,"src_","nullptr",&this->src_,&local_40._M_head_impl);
  iVar2 = local_30[0];
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = (SEARCH_METHODS *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
               ,0x11d,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  puVar3 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar3);
  }
  if (iVar2 != (internal)0x0) {
    local_40._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (local_30,"ref_","nullptr",&this->ref_,&local_40._M_head_impl);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28 == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = (SEARCH_METHODS *)*local_28;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
                 ,0x11e,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
    }
    if (local_28 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_28 != local_28 + 2) {
        operator_delete((undefined8 *)*local_28);
      }
      operator_delete(local_28);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = GET_PARAM(0);
    width_ = GET_PARAM(1);
    is_hbd_ =
#if CONFIG_AV1_HIGHBITDEPTH
        params_.ref_func == aom_highbd_sse_c;
#else
        false;
#endif
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src_ = reinterpret_cast<uint8_t *>(aom_memalign(32, 256 * 256 * 2));
    ref_ = reinterpret_cast<uint8_t *>(aom_memalign(32, 256 * 256 * 2));
    ASSERT_NE(src_, nullptr);
    ASSERT_NE(ref_, nullptr);
  }